

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> * __thiscall
pstore::dump::binary::writer<std::wostream>
          (binary *this,basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,indent *ind)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar4;
  long lVar5;
  int line;
  byte *pbVar6;
  long lVar7;
  long lVar8;
  char *str;
  byte *pbVar9;
  accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> acc;
  accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_> local_b8;
  long local_58;
  long local_50;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *local_48;
  byte *local_40;
  long local_38;
  
  local_b8.chars_to_reserve_ = ind->count_ * 0x32 + 0xfd2;
  local_b8.indent_string_._M_dataplus._M_p = (pointer)&local_b8.indent_string_.field_2;
  local_b8.os_ = os;
  std::__cxx11::wstring::_M_construct((ulong)&local_b8.indent_string_,ind->count_);
  local_b8.lines_._M_dataplus._M_p = (pointer)&local_b8.lines_.field_2;
  local_b8.width_ = 0;
  local_b8.line_count_ = 0;
  local_b8.lines_._M_string_length = 0;
  local_b8.lines_.field_2._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)&local_b8.lines_);
  std::operator<<(os,"!!binary |\n");
  pbVar9 = (this->v_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = (this->v_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar7 = (long)local_40 - (long)pbVar9;
  lVar5 = lVar7 / 3;
  lVar8 = lVar5;
  pbVar4 = os;
  if (2 < lVar7) {
    do {
      local_48 = pbVar4;
      local_50 = lVar7;
      local_58 = lVar8;
      pbVar6 = pbVar9;
      bVar1 = *pbVar6;
      bVar2 = pbVar6[1];
      bVar3 = pbVar6[2];
      local_38 = lVar5;
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]);
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [((uint)bVar1 << 0x10 | (uint)bVar2 << 8) >> 0xc & 0x3f]);
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(ushort)(CONCAT11(bVar2,bVar3) >> 6) & 0x3f]);
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar3 & 0x3f]);
      lVar5 = local_38 + -1;
      pbVar9 = pbVar6 + 3;
      lVar8 = local_58;
      lVar7 = local_50;
      pbVar4 = local_48;
    } while (lVar5 != 0);
    pbVar9 = pbVar6 + 3;
    lVar5 = local_58;
    os = local_48;
  }
  lVar8 = lVar7 + lVar5 * -3;
  if (lVar7 != lVar5 * 3) {
    if (lVar8 == 1) {
      bVar1 = *pbVar9;
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]);
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(bVar1 & 3) << 4]);
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,'=');
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,'=');
      pbVar9 = pbVar9 + 1;
    }
    else {
      if (lVar8 != 2) {
        line = 0x4e;
        str = "false";
        goto LAB_0011ad23;
      }
      bVar1 = *pbVar9;
      bVar2 = pbVar9[1];
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[bVar1 >> 2]);
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [((uint)bVar1 << 0x10 | (uint)bVar2 << 8) >> 0xc & 0x3f]);
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,
                 "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                 [(ulong)(bVar2 & 0xf) * 4]);
      anon_unknown.dwarf_c9337::
      accumulator<std::basic_ostream<wchar_t,_std::char_traits<wchar_t>_>_>::push_back
                (&local_b8,'=');
      pbVar9 = pbVar9 + 2;
    }
  }
  if (pbVar9 == local_40) {
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
              (local_b8.os_,local_b8.lines_._M_dataplus._M_p,local_b8.lines_._M_string_length);
    local_b8.lines_._M_string_length = 0;
    local_b8.width_ = 0;
    local_b8.line_count_ = 0;
    *local_b8.lines_._M_dataplus._M_p = L'\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8.lines_._M_dataplus._M_p != &local_b8.lines_.field_2) {
      operator_delete(local_b8.lines_._M_dataplus._M_p,
                      CONCAT44(local_b8.lines_.field_2._M_local_buf[1],
                               local_b8.lines_.field_2._M_local_buf[0]) * 4 + 4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_b8.indent_string_._M_dataplus._M_p != &local_b8.indent_string_.field_2) {
      operator_delete(local_b8.indent_string_._M_dataplus._M_p,
                      local_b8.indent_string_.field_2._M_allocated_capacity * 4 + 4);
    }
    return os;
  }
  line = 0x51;
  str = "first == last";
LAB_0011ad23:
  assert_failed(str,
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/base64.hpp"
                ,line);
}

Assistant:

OStream & binary::writer (OStream & os, indent const & ind) const {
            accumulator<OStream> acc (os, ind);
            os << "!!binary |\n";
            to_base64 (std::begin (v_), std::end (v_), std::back_inserter (acc));
            acc.flush ();
            return os;
        }